

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O0

Abc_Cex_t *
Bmc_CexCareSatBasedMinimizeAig(Gia_Man_t *p,Abc_Cex_t *pCex,int fHighEffort,int fVerbose)

{
  Cnf_Dat_t *pCVar1;
  sat_solver *p_00;
  Abc_Cex_t *pAVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  abctime aVar8;
  Gia_Man_t *pGia;
  int *piVar9;
  int *end;
  char *pcVar10;
  Gia_Man_t *pFrames;
  Abc_Cex_t *pAStack_78;
  int CountBest;
  Abc_Cex_t *pCexBest;
  int *pFinal;
  Cnf_Dat_t *pCStack_60;
  int nFinal;
  Cnf_Dat_t *pCnf;
  sat_solver *pSat;
  Vec_Int_t *vTemp;
  Vec_Int_t *vLits;
  int local_38;
  int status;
  int iLit;
  int iFirstVar;
  int i;
  int n;
  abctime clk;
  int fVerbose_local;
  int fHighEffort_local;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  clk._0_4_ = fVerbose;
  clk._4_4_ = fHighEffort;
  _fVerbose_local = pCex;
  pCex_local = (Abc_Cex_t *)p;
  _i = Abc_Clock();
  vTemp = (Vec_Int_t *)0x0;
  pFrames._4_4_ = 0;
  _i = Abc_Clock();
  pAVar2 = pCex_local;
  iVar3 = Gia_ManPiNum((Gia_Man_t *)pCex_local);
  pAStack_78 = Bmc_CexCareMinimizeAig((Gia_Man_t *)pAVar2,iVar3,_fVerbose_local,1,1,(int)clk);
  for (iLit = pAStack_78->nRegs; iLit < pAStack_78->nBits; iLit = iLit + 1) {
    iVar3 = Abc_InfoHasBit((uint *)(pAStack_78 + 1),iLit);
    pFrames._4_4_ = iVar3 + pFrames._4_4_;
  }
  if ((int)clk != 0) {
    printf("Care bits = %d. ",(ulong)pFrames._4_4_);
    aVar8 = Abc_Clock();
    Abc_PrintTime(1,"Non-SAT-based CEX minimization",aVar8 - _i);
  }
  _i = Abc_Clock();
  pGia = Gia_ManFramesForCexMin((Gia_Man_t *)pCex_local,_fVerbose_local->iFrame + 1);
  pCStack_60 = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,0,0,0,0);
  status = pCStack_60->nVars - (_fVerbose_local->iFrame + 1) * _fVerbose_local->nPis;
  pCnf = (Cnf_Dat_t *)Cnf_DataWriteIntoSolver(pCStack_60,1,0);
  local_38 = Abc_Var2Lit(1,1);
  vLits._4_4_ = sat_solver_addclause((sat_solver *)pCnf,&local_38,&status);
  if (vLits._4_4_ == 0) {
    __assert_fail("status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCex.c"
                  ,0x224,
                  "Abc_Cex_t *Bmc_CexCareSatBasedMinimizeAig(Gia_Man_t *, Abc_Cex_t *, int, int)");
  }
  pSat = (sat_solver *)Vec_IntAlloc(100);
  for (iLit = _fVerbose_local->nRegs; p_00 = pSat, iLit < _fVerbose_local->nBits; iLit = iLit + 1) {
    iVar4 = status + iLit;
    iVar3 = _fVerbose_local->nRegs;
    iVar5 = Abc_InfoHasBit((uint *)(_fVerbose_local + 1),iLit);
    iVar3 = Abc_Var2Lit(iVar4 - iVar3,(uint)((iVar5 != 0 ^ 0xffU) & 1));
    Vec_IntPush((Vec_Int_t *)p_00,iVar3);
  }
  if ((int)clk != 0) {
    aVar8 = Abc_Clock();
    Abc_PrintTime(1,"Constructing SAT solver",aVar8 - _i);
  }
  for (iFirstVar = 0; iFirstVar < 2; iFirstVar = iFirstVar + 1) {
    Vec_IntFreeP(&vTemp);
    vTemp = Vec_IntDup((Vec_Int_t *)pSat);
    if (iFirstVar != 0) {
      Vec_IntReverseOrder(vTemp);
    }
    _i = Abc_Clock();
    pCVar1 = pCnf;
    piVar9 = Vec_IntArray(vTemp);
    end = Vec_IntLimit(vTemp);
    vLits._4_4_ = sat_solver_solve((sat_solver *)pCVar1,piVar9,end,0,0,0,0);
    uVar6 = sat_solver_final((sat_solver *)pCnf,(int **)&pCexBest);
    pFinal._4_4_ = uVar6;
    if ((int)clk != 0) {
      pcVar10 = "BUG";
      if (vLits._4_4_ == -1) {
        pcVar10 = "OK ";
      }
      Vec_IntSize(vTemp);
      printf("Status %s   Selected %5d assumptions out of %5d.  ",pcVar10,(ulong)uVar6);
      aVar8 = Abc_Clock();
      Abc_PrintTime(1,"Analyze_final",aVar8 - _i);
    }
    if ((int)pFinal._4_4_ < (int)pFrames._4_4_) {
      pFrames._4_4_ = pFinal._4_4_;
      if (pAStack_78 != (Abc_Cex_t *)0x0) {
        free(pAStack_78);
      }
      pAStack_78 = Bmc_CexCareDeriveCex(_fVerbose_local,status,&pCexBest->iPo,pFinal._4_4_);
    }
    if (clk._4_4_ != 0) {
      _i = Abc_Clock();
      pCVar1 = pCnf;
      piVar9 = Vec_IntArray(vTemp);
      iVar3 = Vec_IntSize(vTemp);
      uVar6 = sat_solver_minimize_assumptions((sat_solver *)pCVar1,piVar9,iVar3,0);
      pFinal._4_4_ = uVar6;
      if ((int)clk != 0) {
        pcVar10 = "BUG";
        if (vLits._4_4_ == -1) {
          pcVar10 = "OK ";
        }
        uVar7 = Vec_IntSize(vTemp);
        printf("Status %s   Selected %5d assumptions out of %5d.  ",pcVar10,(ulong)uVar6,
               (ulong)uVar7);
        aVar8 = Abc_Clock();
        Abc_PrintTime(1,"LEXUNSAT     ",aVar8 - _i);
      }
      if ((int)pFinal._4_4_ < (int)pFrames._4_4_) {
        pFrames._4_4_ = pFinal._4_4_;
        if (pAStack_78 != (Abc_Cex_t *)0x0) {
          free(pAStack_78);
        }
        pAVar2 = _fVerbose_local;
        iVar3 = status;
        piVar9 = Vec_IntArray(vTemp);
        pAStack_78 = Bmc_CexCareDeriveCex(pAVar2,iVar3,piVar9,pFinal._4_4_);
      }
    }
  }
  if ((int)clk != 0) {
    printf("Final    :    ");
    Bmc_CexPrint(pAStack_78,pAStack_78->nPis,0);
  }
  Vec_IntFreeP(&vTemp);
  Vec_IntFreeP((Vec_Int_t **)&pSat);
  sat_solver_delete((sat_solver *)pCnf);
  Cnf_DataFree(pCStack_60);
  Gia_ManStop(pGia);
  return pAStack_78;
}

Assistant:

Abc_Cex_t * Bmc_CexCareSatBasedMinimizeAig( Gia_Man_t * p, Abc_Cex_t * pCex, int fHighEffort, int fVerbose )
{
    abctime clk = Abc_Clock();
    int n, i, iFirstVar, iLit, status;
    Vec_Int_t * vLits = NULL, * vTemp;
    sat_solver * pSat;
    Cnf_Dat_t * pCnf;
    int nFinal, * pFinal;
    Abc_Cex_t * pCexBest = NULL; 
    int CountBest = 0;
    Gia_Man_t * pFrames;

    // CEX minimization
    clk = Abc_Clock();
    pCexBest = Bmc_CexCareMinimizeAig( p, Gia_ManPiNum(p), pCex, 1, 1, fVerbose );
    for ( i = pCexBest->nRegs; i < pCexBest->nBits; i++ )
        CountBest += Abc_InfoHasBit(pCexBest->pData, i);
    if ( fVerbose )
    {
        printf( "Care bits = %d. ", CountBest );
        Abc_PrintTime( 1, "Non-SAT-based CEX minimization", Abc_Clock() - clk );
    }

    // SAT instance
    clk = Abc_Clock();
    pFrames = Gia_ManFramesForCexMin( p, pCex->iFrame + 1 );
    pCnf = (Cnf_Dat_t*)Mf_ManGenerateCnf( pFrames, 8, 0, 0, 0, 0 );
    iFirstVar = pCnf->nVars - (pCex->iFrame+1) * pCex->nPis;
    pSat = (sat_solver*)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    iLit = Abc_Var2Lit( 1, 1 );
    status = sat_solver_addclause( pSat, &iLit, &iLit + 1 );
    assert( status );
    // create literals
    vTemp = Vec_IntAlloc( 100 );
    for ( i = pCex->nRegs; i < pCex->nBits; i++ )
        Vec_IntPush( vTemp, Abc_Var2Lit(iFirstVar + i - pCex->nRegs, !Abc_InfoHasBit(pCex->pData, i)) );
    if ( fVerbose )
    Abc_PrintTime( 1, "Constructing SAT solver", Abc_Clock() - clk );

    for ( n = 0; n < 2; n++ )
    {
        Vec_IntFreeP( &vLits );

        vLits = Vec_IntDup( vTemp );
        if ( n ) Vec_IntReverseOrder( vLits );

        // SAT-based minimization
        clk = Abc_Clock();
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), 0, 0, 0, 0 );
        nFinal = sat_solver_final( pSat, &pFinal );
        if ( fVerbose )
        {
            printf( "Status %s   Selected %5d assumptions out of %5d.  ", status == l_False ? "OK ":"BUG", nFinal, Vec_IntSize(vLits) );
            Abc_PrintTime( 1, "Analyze_final", Abc_Clock() - clk );
        }
        if ( CountBest > nFinal )
        {
            CountBest = nFinal;
            ABC_FREE( pCexBest );
            pCexBest = Bmc_CexCareDeriveCex( pCex, iFirstVar, pFinal, nFinal );
        }
        if ( !fHighEffort )
            continue;

        // SAT-based minimization
        clk = Abc_Clock();
        nFinal = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vLits), Vec_IntSize(vLits), 0 );
        if ( fVerbose )
        {
            printf( "Status %s   Selected %5d assumptions out of %5d.  ", status == l_False ? "OK ":"BUG", nFinal, Vec_IntSize(vLits) );
            Abc_PrintTime( 1, "LEXUNSAT     ", Abc_Clock() - clk );
        }
        if ( CountBest > nFinal )
        {
            CountBest = nFinal;
            ABC_FREE( pCexBest );
            pCexBest = Bmc_CexCareDeriveCex( pCex, iFirstVar, Vec_IntArray(vLits), nFinal );
        }
    }
    if ( fVerbose )
    {
        printf( "Final    :    " );
        Bmc_CexPrint( pCexBest, pCexBest->nPis, 0 );
    }
    // cleanup
    Vec_IntFreeP( &vLits );
    Vec_IntFreeP( &vTemp );
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Gia_ManStop( pFrames );
    return pCexBest;
}